

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O1

int find_ipv4_start_node(MMDB_s *mmdb)

{
  uint uVar1;
  uint8_t *puVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  code *local_38;
  
  if ((mmdb->ipv4_start_node).node_value != 0) {
    return 0;
  }
  uVar6 = mmdb->full_record_byte_size;
  uVar8 = (uint)uVar6;
  if (uVar6 == 8) {
    local_38 = get_uint32;
  }
  else if (uVar6 == 7) {
    local_38 = get_left_28_bit_record;
  }
  else {
    if (uVar8 != 6) {
      local_38 = (code *)0x0;
      bVar3 = true;
      goto LAB_001032ed;
    }
    local_38 = get_uint24;
  }
  bVar3 = false;
LAB_001032ed:
  iVar5 = 6;
  if (!bVar3) {
    uVar1 = (mmdb->metadata).node_count;
    if (uVar1 == 0) {
      uVar4 = 0;
      uVar6 = 0;
    }
    else {
      puVar2 = mmdb->file_content;
      uVar4 = 0;
      uVar7 = 0;
      do {
        if (mmdb->data_section < puVar2 + uVar4 * uVar8 + uVar8) {
          return 2;
        }
        uVar4 = (*local_38)(puVar2 + uVar4 * uVar8);
        uVar6 = uVar7 + 1;
      } while ((uVar7 < 0x5f) && (uVar7 = uVar6, uVar4 < uVar1));
    }
    (mmdb->ipv4_start_node).node_value = uVar4;
    (mmdb->ipv4_start_node).netmask = uVar6;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int find_ipv4_start_node(MMDB_s *const mmdb) {
    /* In a pathological case of a database with a single node search tree,
     * this check will be true even after we've found the IPv4 start node, but
     * that doesn't seem worth trying to fix. */
    if (mmdb->ipv4_start_node.node_value != 0) {
        return MMDB_SUCCESS;
    }

    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    uint32_t node_value = 0;
    const uint8_t *record_pointer;
    uint16_t netmask;
    uint32_t node_count = mmdb->metadata.node_count;

    for (netmask = 0; netmask < 96 && node_value < node_count; netmask++) {
        record_pointer = &search_tree[node_value * record_info.record_length];
        if (record_pointer + record_info.record_length > mmdb->data_section) {
            return MMDB_CORRUPT_SEARCH_TREE_ERROR;
        }
        node_value = record_info.left_record_getter(record_pointer);
    }

    mmdb->ipv4_start_node.node_value = node_value;
    mmdb->ipv4_start_node.netmask = netmask;

    return MMDB_SUCCESS;
}